

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O2

void __thiscall HevcUnit::updateBits(HevcUnit *this,int bitOffset,int bitLen,uint value)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  byte *buffer;
  BitStreamWriter bitWriter;
  
  buffer = (byte *)((long)(bitOffset / 8) + (long)(this->m_reader).super_BitStream.m_initBuffer);
  bitWriter.super_BitStream.m_totalBits = 0;
  bitWriter.m_curVal = 0;
  bitWriter.m_bitWrited = 0;
  bitWriter.super_BitStream.m_buffer = (uint *)0x0;
  bitWriter.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer(&bitWriter,buffer,buffer + (long)(bitLen / 8) + 5);
  puVar1 = (this->m_reader).super_BitStream.m_initBuffer;
  iVar3 = (bitOffset + bitLen) % 8;
  uVar2 = (uint)((long)bitOffset % 8);
  if (0 < (int)uVar2) {
    BitStreamWriter::putBits
              (&bitWriter,uVar2,(uint)(*buffer >> (8U - (char)((long)bitOffset % 8) & 0x1f)));
  }
  BitStreamWriter::putBits(&bitWriter,bitLen,value);
  if (0 < iVar3) {
    uVar2 = 8 - iVar3;
    BitStreamWriter::putBits
              (&bitWriter,uVar2,
               ~(-1 << ((byte)uVar2 & 0x1f)) &
               (uint)*(byte *)((long)puVar1 + (long)((bitOffset + bitLen) / 8)));
  }
  BitStreamWriter::flushBits(&bitWriter);
  return;
}

Assistant:

void HevcUnit::updateBits(const int bitOffset, const int bitLen, const unsigned value) const
{
    uint8_t* ptr = m_reader.getBuffer() + bitOffset / 8;
    BitStreamWriter bitWriter{};
    const int byteOffset = bitOffset % 8;
    bitWriter.setBuffer(ptr, ptr + (bitLen / 8 + 5));

    const uint8_t* ptr_end = m_reader.getBuffer() + (bitOffset + bitLen) / 8;
    const int endBitsPostfix = 8 - ((bitOffset + bitLen) % 8);

    if (byteOffset > 0)
    {
        const int prefix = *ptr >> (8 - byteOffset);
        bitWriter.putBits(byteOffset, prefix);
    }
    bitWriter.putBits(bitLen, value);

    if (endBitsPostfix < 8)
    {
        const int postfix = *ptr_end & (1 << endBitsPostfix) - 1;
        bitWriter.putBits(endBitsPostfix, postfix);
    }
    bitWriter.flushBits();
}